

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void SetTexture(sector_t *sector,int index,int position,char *name,FMissingTextureTracker *track,
               bool truncate)

{
  bool bVar1;
  FMissingCount *pFVar2;
  int iVar3;
  FString local_40;
  FTextureID local_38;
  undefined1 local_32 [2];
  FTextureID texture;
  char name8 [9];
  bool truncate_local;
  FMissingTextureTracker *track_local;
  char *name_local;
  int position_local;
  int index_local;
  sector_t *sector_local;
  
  track_local = (FMissingTextureTracker *)name;
  if (truncate) {
    strncpy(local_32,name,8);
    track_local = (FMissingTextureTracker *)local_32;
  }
  local_38 = FTextureManager::CheckForTexture(&TexMan,(char *)track_local,2,3);
  bVar1 = FTextureID::Exists(&local_38);
  if (!bVar1) {
    FString::FString(&local_40,(char *)track_local);
    pFVar2 = TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::
             operator[](track,&local_40);
    iVar3 = pFVar2->Count + 1;
    pFVar2->Count = iVar3;
    FString::~FString(&local_40);
    if (iVar3 < 0x15) {
      Printf("\x1cGUnknown %s texture \'\x1cI%s\x1cG\' in sector %d\n",
             SetTexture::positionnames[position],track_local,(ulong)(uint)index);
    }
    local_38 = FTextureManager::GetDefaultTexture(&TexMan);
  }
  sector_t::SetTexture(sector,position,local_38,true);
  return;
}

Assistant:

void SetTexture (sector_t *sector, int index, int position, const char *name, FMissingTextureTracker &track, bool truncate)
{
	static const char *positionnames[] = { "floor", "ceiling" };
	char name8[9];
	if (truncate)
	{
		strncpy(name8, name, 8);
		name8[8] = 0;
		name = name8;
	}

	FTextureID texture = TexMan.CheckForTexture (name, FTexture::TEX_Flat,
			FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);

	if (!texture.Exists())
	{
		if (++track[name].Count <= MISSING_TEXTURE_WARN_LIMIT)
		{
			Printf(TEXTCOLOR_RED"Unknown %s texture '"
				TEXTCOLOR_ORANGE "%s" TEXTCOLOR_RED
				"' in sector %d\n",
				positionnames[position], name, index);
		}
		texture = TexMan.GetDefaultTexture();
	}
	sector->SetTexture(position, texture);
}